

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegmentMerge(Fts3Table *p,int iLangid,int iIndex,int iLevel)

{
  u32 *puVar1;
  byte bVar2;
  Fts3Table *p_00;
  Fts3SegReader **ppFVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uchar *q;
  Mem *pMVar10;
  SegmentNode **ppSVar11;
  SegmentNode *pSVar12;
  SegmentNode *pSVar13;
  ulong uVar14;
  byte *pbVar15;
  i64 iVar16;
  byte *pbVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  char *pcVar22;
  u64 uVar23;
  sqlite3_stmt *psVar24;
  ulong uVar25;
  int iVar26;
  size_t sVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  SegmentNode **local_128;
  sqlite3_stmt *pStmt;
  SegmentNode *local_118;
  i64 local_110;
  Fts3Table *local_108;
  int local_fc;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  char *local_e0;
  int local_d4;
  i64 local_d0;
  ulong local_c8;
  ulong local_c0;
  char *zRoot;
  char *local_b0;
  sqlite3_stmt *pNextIdx;
  undefined8 uStack_a0;
  ulong local_98;
  Fts3MultiSegReader csr;
  
  csr.nTerm = 0;
  csr._68_4_ = 0;
  csr.aDoclist = (char *)0x0;
  csr.bLookup = 0;
  csr._52_4_ = 0;
  csr.zTerm = (char *)0x0;
  csr.nBuffer = 0;
  csr.iColFilter = 0;
  csr.bRestart = 0;
  csr.nCost = 0;
  csr.pFilter = (Fts3SegFilter *)0x0;
  csr.aBuffer = (char *)0x0;
  csr.apSegment = (Fts3SegReader **)0x0;
  csr.nSegment = 0;
  csr.nAdvance = 0;
  csr.nDoclist = 0;
  csr._84_4_ = 0;
  ppSVar11 = (SegmentNode **)0x0;
  iVar6 = fts3SegReaderCursor(p,iLangid,iIndex,iLevel,(char *)0x0,0,1,0,&csr);
  if ((iVar6 != 0) || (csr.nSegment == 0)) goto LAB_001c13ff;
  if (iLevel == -1) {
    local_110 = 0;
LAB_001c1282:
    local_108 = p;
    local_fc = iIndex;
    if (iLevel == -2) {
      uVar7 = 3;
      if ((csr.nSegment == 1) && ((*csr.apSegment)->ppNextElem == (Fts3HashElem **)0x0)) {
        iVar6 = 0x65;
        goto LAB_001c13fc;
      }
      local_f8 = 0;
      iVar6 = 0;
      iVar16 = local_110;
    }
    else {
      lVar31 = (long)iLevel + 1;
      iVar8 = p->nIndex;
      local_f8 = 0;
      iVar6 = fts3SqlStmt(p,8,&pNextIdx,(sqlite3_value **)0x0);
      psVar24 = pNextIdx;
      uVar33 = 0;
      if (iVar6 == 0) {
        sqlite3_bind_int64(pNextIdx,1,
                           ((long)local_108->nIndex * (long)iLangid + (long)iIndex) * 0x400 + lVar31
                          );
        iVar6 = sqlite3_step(psVar24);
        uVar33 = 0;
        if (iVar6 == 100) {
          pMVar10 = columnMem(psVar24,0);
          uVar33 = sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar24);
        }
        iVar6 = sqlite3_reset(psVar24);
      }
      p = local_108;
      iVar16 = (long)iLevel + ((long)iVar8 * (long)iLangid + (long)iIndex) * 0x400 + 1;
      if (iVar6 == 0) {
        iVar6 = 0;
        local_f8 = uVar33 & 0xffffffff;
        if (0xf < (int)uVar33) {
          iVar6 = fts3SegmentMerge(local_108,iLangid,local_fc,(int)lVar31);
          local_f8 = 0;
        }
      }
      uVar7 = (uint)(local_110 < iVar16 && iLevel != -1) * 2 + 1;
    }
    if (iVar6 == 0) {
      csr.pFilter = (Fts3SegFilter *)&pNextIdx;
      pNextIdx = (sqlite3_stmt *)0x0;
      uStack_a0._0_4_ = 0;
      uStack_a0._4_4_ = 0;
      local_98 = (ulong)uVar7;
      local_d0 = iVar16;
      iVar6 = fts3SegReaderStart(p,&csr,(char *)0x0,0);
      local_128 = (SegmentNode **)0x0;
joined_r0x001c1485:
      ppSVar11 = local_128;
      if ((iVar6 == 0) && (iVar6 = sqlite3Fts3SegReaderStep(p,&csr), iVar6 == 100)) {
        iVar8 = csr.nTerm;
        uVar14 = csr._64_8_ & 0xffffffff;
        uVar33 = (ulong)csr.nDoclist;
        local_b0 = csr.aDoclist;
        pcVar22 = csr.zTerm;
        pcVar32 = csr.aDoclist;
        local_128 = ppSVar11;
        if (ppSVar11 == (SegmentNode **)0x0) goto LAB_001c154e;
        goto LAB_001c1646;
      }
      ppFVar3 = csr.apSegment;
      if (iVar6 != 0) goto LAB_001c13ff;
      if (iLevel == -1) {
        if (ppSVar11 != (SegmentNode **)0x0) goto LAB_001c1b27;
      }
      else {
        uVar33 = (ulong)csr.nSegment;
        pStmt = (sqlite3_stmt *)0x0;
        if ((long)uVar33 < 1) {
          iVar6 = 0;
          bVar35 = true;
        }
        else {
          uVar14 = 1;
          do {
            iVar6 = fts3DeleteSegment(p,ppFVar3[uVar14 - 1]);
            bVar35 = iVar6 == 0;
            if (!bVar35) break;
            bVar34 = uVar14 < uVar33;
            uVar14 = uVar14 + 1;
          } while (bVar34);
        }
        if (bVar35) {
          if (iLevel == -2) {
            iVar6 = fts3SqlStmt(p,0x1a,&pStmt,(sqlite3_value **)0x0);
            psVar24 = pStmt;
            if (iVar6 == 0) {
              lVar31 = (long)local_fc;
              sqlite3_bind_int64(pStmt,1,((long)p->nIndex * (long)iLangid + lVar31) * 0x400);
              uVar33 = ((long)p->nIndex * (long)iLangid + lVar31) * 0x400 | 0x3ff;
              iVar6 = 2;
LAB_001c1aee:
              sqlite3_bind_int64(psVar24,iVar6,uVar33);
              iVar6 = 0;
            }
          }
          else {
            iVar6 = fts3SqlStmt(p,0x10,&pStmt,(sqlite3_value **)0x0);
            if (iVar6 == 0) {
              uVar33 = (long)iLevel + ((long)local_fc + (long)p->nIndex * (long)iLangid) * 0x400;
              iVar6 = 1;
              psVar24 = pStmt;
              goto LAB_001c1aee;
            }
          }
          psVar24 = pStmt;
          if (iVar6 == 0) {
            sqlite3_step(pStmt);
            iVar6 = sqlite3_reset(psVar24);
          }
        }
        if ((iVar6 != 0) || (ppSVar11 == (SegmentNode **)0x0)) goto LAB_001c13ff;
LAB_001c1b27:
        if (*ppSVar11 == (SegmentNode *)0x0) {
          iVar6 = fts3WriteSegdir(p,local_d0,(int)local_f8,0,0,0,(sqlite3_int64)ppSVar11[8],
                                  (char *)ppSVar11[7],*(int *)((long)ppSVar11 + 0x34));
        }
        else {
          pStmt = (sqlite3_stmt *)0x0;
          zRoot = (char *)0x0;
          local_d4 = 0;
          pSVar13 = ppSVar11[2];
          ppSVar11[2] = (SegmentNode *)((long)&pSVar13->pParent + 1);
          iVar6 = fts3WriteSegment(p,(sqlite3_int64)pSVar13,(char *)ppSVar11[7],
                                   *(int *)((long)ppSVar11 + 0x34));
          if (iVar6 == 0) {
            iVar6 = fts3NodeWrite(p,*ppSVar11,1,(sqlite3_int64)ppSVar11[1],
                                  (sqlite3_int64)ppSVar11[2],(sqlite3_int64 *)&pStmt,&zRoot,
                                  &local_d4);
          }
          if (iVar6 == 0) {
            iVar6 = fts3WriteSegdir(p,local_d0,(int)local_f8,(sqlite3_int64)ppSVar11[1],
                                    (sqlite3_int64)pSVar13,(sqlite3_int64)pStmt,
                                    (sqlite3_int64)ppSVar11[8],zRoot,local_d4);
          }
        }
        p->nLeafAdd = p->nLeafAdd + 1;
        if (iVar6 != 0) goto LAB_001c13ff;
        if ((iLevel == -1) || (local_d0 < local_110)) {
          iVar6 = fts3PromoteSegments(p,local_d0,(sqlite3_int64)ppSVar11[8]);
          goto LAB_001c13ff;
        }
      }
      iVar6 = 0;
      goto LAB_001c13ff;
    }
  }
  else {
    local_110 = 0;
    iVar6 = fts3SqlStmt(p,0xf,&pNextIdx,(sqlite3_value **)0x0);
    psVar24 = pNextIdx;
    if (iVar6 == 0) {
      sqlite3_bind_int64(pNextIdx,1,((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400);
      sqlite3_bind_int64(psVar24,2,((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 | 0x3ff)
      ;
      iVar6 = sqlite3_step(psVar24);
      if (iVar6 == 100) {
        pMVar10 = columnMem(psVar24,0);
        local_110 = sqlite3VdbeIntValue(pMVar10);
        columnMallocFailure(psVar24);
      }
      else {
        local_110 = 0;
      }
      iVar6 = sqlite3_reset(psVar24);
    }
    if (iVar6 == 0) goto LAB_001c1282;
  }
LAB_001c13fc:
  ppSVar11 = (SegmentNode **)0x0;
LAB_001c13ff:
  if (ppSVar11 != (SegmentNode **)0x0) {
    sqlite3_free(ppSVar11[7]);
    sqlite3_free(ppSVar11[5]);
    fts3NodeFree(*ppSVar11);
    sqlite3_free(ppSVar11);
  }
  sqlite3Fts3SegReaderFinish(&csr);
  return iVar6;
LAB_001c154e:
  local_e0 = csr.zTerm;
  local_f0 = uVar33;
  iVar6 = sqlite3_initialize();
  if (iVar6 == 0) {
    ppSVar11 = (SegmentNode **)sqlite3Malloc(0x48);
  }
  else {
    ppSVar11 = (SegmentNode **)0x0;
  }
  pcVar32 = (char *)0x7;
  if (ppSVar11 == (SegmentNode **)0x0) {
    bVar35 = false;
  }
  else {
    ppSVar11[6] = (SegmentNode *)0x0;
    ppSVar11[7] = (SegmentNode *)0x0;
    ppSVar11[4] = (SegmentNode *)0x0;
    ppSVar11[5] = (SegmentNode *)0x0;
    ppSVar11[2] = (SegmentNode *)0x0;
    ppSVar11[3] = (SegmentNode *)0x0;
    *ppSVar11 = (SegmentNode *)0x0;
    ppSVar11[1] = (SegmentNode *)0x0;
    ppSVar11[8] = (SegmentNode *)0x0;
    pSVar13 = (SegmentNode *)sqlite3_malloc(p->nNodeSize);
    ppSVar11[7] = pSVar13;
    local_128 = ppSVar11;
    if (pSVar13 == (SegmentNode *)0x0) {
      bVar35 = false;
    }
    else {
      *(int *)(ppSVar11 + 6) = p->nNodeSize;
      bVar35 = false;
      uVar7 = fts3SqlStmt(p,10,&pStmt,(sqlite3_value **)0x0);
      psVar24 = pStmt;
      if (uVar7 == 0) {
        iVar6 = sqlite3_step(pStmt);
        if (iVar6 == 100) {
          pMVar10 = columnMem(psVar24,0);
          pSVar13 = (SegmentNode *)sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar24);
          ppSVar11[2] = pSVar13;
          ppSVar11[1] = pSVar13;
        }
        uVar7 = sqlite3_reset(psVar24);
        pcVar32 = (char *)(ulong)uVar7;
        bVar35 = uVar7 == 0;
      }
      else {
        pcVar32 = (char *)(ulong)uVar7;
      }
    }
  }
  iVar6 = (int)pcVar32;
  pcVar22 = local_e0;
  uVar33 = local_f0;
  if (!bVar35) goto joined_r0x001c1485;
LAB_001c1646:
  p_00 = local_108;
  iVar6 = (int)pcVar32;
  uVar7 = *(uint *)(ppSVar11 + 4);
  if ((int)uVar7 < 1) {
    uVar30 = 0;
  }
  else {
    uVar30 = 0;
    do {
      if (*(char *)((long)&ppSVar11[3]->pParent + uVar30) != pcVar22[uVar30]) goto LAB_001c166f;
      uVar30 = uVar30 + 1;
    } while (uVar7 != uVar30);
    uVar30 = (ulong)uVar7;
  }
LAB_001c166f:
  iVar28 = (int)uVar30;
  pSVar13 = (SegmentNode *)(ulong)(uint)(iVar8 - iVar28);
  if (iVar8 - iVar28 == 0 || iVar8 < iVar28) {
    iVar6 = 0x10b;
    goto joined_r0x001c1485;
  }
  local_c0 = (ulong)iVar8;
  uVar7 = *(uint *)((long)ppSVar11 + 0x34);
  local_e8 = (ulong)uVar7;
  uVar18 = iVar8 + (int)uVar33 + 2;
  uVar30 = (long)iVar28;
  iVar8 = (uVar7 + iVar8 + (int)uVar33 + 2) - iVar28;
  uVar20 = uVar18 - iVar28;
  do {
    iVar9 = iVar8;
    uVar25 = uVar30 >> 7;
    bVar35 = 0x7f < uVar30;
    pSVar12 = pSVar13;
    uVar30 = uVar25;
    iVar8 = iVar9 + 1;
    uVar5 = uVar20;
    uVar20 = uVar20 + 1;
  } while (bVar35);
  do {
    uVar20 = uVar5;
    iVar8 = iVar9;
    bVar35 = (SegmentNode *)0x7f < pSVar12;
    uVar30 = uVar33;
    pSVar12 = (SegmentNode *)((ulong)pSVar12 >> 7);
    iVar9 = iVar8 + 1;
    uVar5 = uVar20 + 1;
  } while (bVar35);
  do {
    iVar8 = iVar8 + 1;
    uVar20 = uVar20 + 1;
    bVar35 = 0x7f < uVar30;
    uVar30 = uVar30 >> 7;
  } while (bVar35);
  local_f0 = uVar33;
  local_e0 = pcVar22;
  local_c8 = uVar14;
  if (((int)uVar7 < 1) || (iVar8 <= local_108->nNodeSize)) goto LAB_001c1786;
  pSVar12 = ppSVar11[2];
  ppSVar11[2] = (SegmentNode *)((long)&pSVar12->pParent + 1);
  local_118 = pSVar13;
  iVar8 = fts3WriteSegment(local_108,(sqlite3_int64)pSVar12,(char *)ppSVar11[7],uVar7);
  if (iVar8 == 0) {
    puVar1 = &p_00->nLeafAdd;
    *puVar1 = *puVar1 + 1;
    iVar8 = fts3NodeAddTerm(p_00,ppSVar11,(int)local_e0,(char *)(ulong)(iVar28 + 1),(int)uVar25);
    if (iVar8 != 0) goto LAB_001c176a;
    *(undefined4 *)(ppSVar11 + 4) = 0;
    uVar33 = local_c0;
    do {
      uVar20 = uVar18;
      bVar35 = 0x7f < uVar33;
      uVar14 = local_f0;
      uVar33 = uVar33 >> 7;
      uVar18 = uVar20 + 1;
    } while (bVar35);
    do {
      uVar20 = uVar20 + 1;
      bVar35 = 0x7f < uVar14;
      uVar14 = uVar14 >> 7;
    } while (bVar35);
    local_e8 = 0;
    bVar35 = true;
    pSVar13 = (SegmentNode *)(local_c8 & 0xffffffff);
    iVar28 = 0;
  }
  else {
LAB_001c176a:
    bVar35 = false;
    pSVar13 = local_118;
    iVar6 = iVar8;
  }
  p = local_108;
  if (!bVar35) goto joined_r0x001c1485;
LAB_001c1786:
  iVar8 = (int)local_f0;
  ppSVar11[8] = (SegmentNode *)((long)&ppSVar11[8]->pParent + (long)(int)uVar20);
  if (*(int *)(ppSVar11 + 6) < (int)uVar20) {
    local_118 = ppSVar11[7];
    iVar9 = sqlite3_initialize();
    if (iVar9 == 0) {
      uVar23 = 0;
      if (0 < (int)uVar20) {
        uVar23 = (u64)uVar20;
      }
      pSVar12 = (SegmentNode *)sqlite3Realloc(local_118,uVar23);
    }
    else {
      pSVar12 = (SegmentNode *)0x0;
    }
    if (pSVar12 == (SegmentNode *)0x0) {
      iVar6 = 7;
      p = local_108;
      goto joined_r0x001c1485;
    }
    ppSVar11[7] = pSVar12;
    *(uint *)(ppSVar11 + 6) = uVar20;
  }
  pbVar15 = (byte *)((long)&ppSVar11[7]->pParent + (long)(int)local_e8);
  iVar9 = (int)pSVar13;
  pbVar4 = pbVar15;
  uVar33 = (long)iVar28;
  iVar19 = (int)local_e8 + iVar9 + 2;
  iVar8 = iVar8 + (int)local_e8 + iVar9 + 2;
  do {
    iVar21 = iVar8;
    iVar26 = iVar19;
    pbVar17 = pbVar4;
    bVar2 = (byte)uVar33;
    *pbVar17 = bVar2 | 0x80;
    bVar35 = 0x7f < uVar33;
    pbVar4 = pbVar17 + 1;
    uVar33 = uVar33 >> 7;
    iVar19 = iVar26 + 1;
    iVar8 = iVar21 + 1;
  } while (bVar35);
  *pbVar17 = bVar2;
  iVar8 = (int)local_e8 + ((int)(pbVar17 + 1) - (int)pbVar15);
  pbVar15 = (byte *)((long)&ppSVar11[7]->pParent + (long)iVar8);
  pbVar4 = pbVar15;
  sVar27 = (long)iVar9;
  do {
    iVar29 = iVar26;
    iVar19 = iVar21;
    pbVar17 = pbVar4;
    bVar2 = (byte)sVar27;
    *pbVar17 = bVar2 | 0x80;
    bVar35 = 0x7f < sVar27;
    pbVar4 = pbVar17 + 1;
    sVar27 = sVar27 >> 7;
    iVar21 = iVar19 + 1;
    iVar26 = iVar29 + 1;
  } while (bVar35);
  *pbVar17 = bVar2;
  iVar8 = iVar8 + ((int)(pbVar17 + 1) - (int)pbVar15);
  local_118 = pSVar13;
  memcpy((void *)((long)&ppSVar11[7]->pParent + (long)iVar8),local_e0 + iVar28,(long)iVar9);
  pbVar4 = (byte *)((long)&ppSVar11[7]->pParent + (long)(iVar8 + (int)local_118));
  uVar33 = local_f0;
  do {
    pbVar15 = pbVar4;
    bVar2 = (byte)uVar33;
    *pbVar15 = bVar2 | 0x80;
    iVar19 = iVar19 + 1;
    iVar29 = iVar29 + 1;
    bVar35 = 0x7f < uVar33;
    pbVar4 = pbVar15 + 1;
    uVar33 = uVar33 >> 7;
  } while (bVar35);
  *pbVar15 = bVar2;
  memcpy((void *)((long)&ppSVar11[7]->pParent + (long)iVar29),local_b0,local_f0);
  *(int *)((long)ppSVar11 + 0x34) = iVar19;
  iVar8 = (int)local_c8;
  if (*(int *)((long)ppSVar11 + 0x24) < iVar8) {
    pSVar13 = ppSVar11[5];
    uVar7 = iVar8 * 2;
    iVar8 = sqlite3_initialize();
    if (iVar8 == 0) {
      uVar23 = 0;
      if (0 < (int)uVar7) {
        uVar23 = (u64)uVar7;
      }
      pSVar13 = (SegmentNode *)sqlite3Realloc(pSVar13,uVar23);
    }
    else {
      pSVar13 = (SegmentNode *)0x0;
    }
    if (pSVar13 == (SegmentNode *)0x0) {
      iVar6 = 7;
    }
    else {
      *(uint *)((long)ppSVar11 + 0x24) = uVar7;
      ppSVar11[5] = pSVar13;
      ppSVar11[3] = pSVar13;
    }
    iVar8 = (int)local_c8;
    p = local_108;
    if (pSVar13 == (SegmentNode *)0x0) goto joined_r0x001c1485;
  }
  p = local_108;
  memcpy(ppSVar11[3],local_e0,local_c0);
  *(int *)(ppSVar11 + 4) = iVar8;
  iVar6 = 0;
  goto joined_r0x001c1485;
}

Assistant:

static int fts3SegmentMerge(
  Fts3Table *p, 
  int iLangid,                    /* Language id to merge */
  int iIndex,                     /* Index in p->aIndex[] to merge */
  int iLevel                      /* Level to merge */
){
  int rc;                         /* Return code */
  int iIdx = 0;                   /* Index of new segment */
  sqlite3_int64 iNewLevel = 0;    /* Level/index to create new segment at */
  SegmentWriter *pWriter = 0;     /* Used to write the new, merged, segment */
  Fts3SegFilter filter;           /* Segment term filter condition */
  Fts3MultiSegReader csr;         /* Cursor to iterate through level(s) */
  int bIgnoreEmpty = 0;           /* True to ignore empty segments */
  i64 iMaxLevel = 0;              /* Max level number for this index/langid */

  assert( iLevel==FTS3_SEGCURSOR_ALL
       || iLevel==FTS3_SEGCURSOR_PENDING
       || iLevel>=0
  );
  assert( iLevel<FTS3_SEGDIR_MAXLEVEL );
  assert( iIndex>=0 && iIndex<p->nIndex );

  rc = sqlite3Fts3SegReaderCursor(p, iLangid, iIndex, iLevel, 0, 0, 1, 0, &csr);
  if( rc!=SQLITE_OK || csr.nSegment==0 ) goto finished;

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3SegmentMaxLevel(p, iLangid, iIndex, &iMaxLevel);
    if( rc!=SQLITE_OK ) goto finished;
  }

  if( iLevel==FTS3_SEGCURSOR_ALL ){
    /* This call is to merge all segments in the database to a single
    ** segment. The level of the new segment is equal to the numerically
    ** greatest segment level currently present in the database for this
    ** index. The idx of the new segment is always 0.  */
    if( csr.nSegment==1 && 0==fts3SegReaderIsPending(csr.apSegment[0]) ){
      rc = SQLITE_DONE;
      goto finished;
    }
    iNewLevel = iMaxLevel;
    bIgnoreEmpty = 1;

  }else{
    /* This call is to merge all segments at level iLevel. find the next
    ** available segment index at level iLevel+1. The call to
    ** fts3AllocateSegdirIdx() will merge the segments at level iLevel+1 to 
    ** a single iLevel+2 segment if necessary.  */
    assert( FTS3_SEGCURSOR_PENDING==-1 );
    iNewLevel = getAbsoluteLevel(p, iLangid, iIndex, iLevel+1);
    rc = fts3AllocateSegdirIdx(p, iLangid, iIndex, iLevel+1, &iIdx);
    bIgnoreEmpty = (iLevel!=FTS3_SEGCURSOR_PENDING) && (iNewLevel>iMaxLevel);
  }
  if( rc!=SQLITE_OK ) goto finished;

  assert( csr.nSegment>0 );
  assert_fts3_nc( iNewLevel>=getAbsoluteLevel(p, iLangid, iIndex, 0) );
  assert_fts3_nc( 
    iNewLevel<getAbsoluteLevel(p, iLangid, iIndex,FTS3_SEGDIR_MAXLEVEL) 
  );

  memset(&filter, 0, sizeof(Fts3SegFilter));
  filter.flags = FTS3_SEGMENT_REQUIRE_POS;
  filter.flags |= (bIgnoreEmpty ? FTS3_SEGMENT_IGNORE_EMPTY : 0);

  rc = sqlite3Fts3SegReaderStart(p, &csr, &filter);
  while( SQLITE_OK==rc ){
    rc = sqlite3Fts3SegReaderStep(p, &csr);
    if( rc!=SQLITE_ROW ) break;
    rc = fts3SegWriterAdd(p, &pWriter, 1, 
        csr.zTerm, csr.nTerm, csr.aDoclist, csr.nDoclist);
  }
  if( rc!=SQLITE_OK ) goto finished;
  assert( pWriter || bIgnoreEmpty );

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3DeleteSegdir(
        p, iLangid, iIndex, iLevel, csr.apSegment, csr.nSegment
    );
    if( rc!=SQLITE_OK ) goto finished;
  }
  if( pWriter ){
    rc = fts3SegWriterFlush(p, pWriter, iNewLevel, iIdx);
    if( rc==SQLITE_OK ){
      if( iLevel==FTS3_SEGCURSOR_PENDING || iNewLevel<iMaxLevel ){
        rc = fts3PromoteSegments(p, iNewLevel, pWriter->nLeafData);
      }
    }
  }

 finished:
  fts3SegWriterFree(pWriter);
  sqlite3Fts3SegReaderFinish(&csr);
  return rc;
}